

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
atoiTest_testPredefinedConstants_Test::~atoiTest_testPredefinedConstants_Test
          (atoiTest_testPredefinedConstants_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(atoiTest, testPredefinedConstants) {
  test<int16_t>(INT16_MIN, std::to_string(INT16_MIN)); 
  test<int16_t>(INT16_MAX, std::to_string(INT16_MAX));

  test<int32_t>(INT32_MIN, std::to_string(INT32_MIN)); 
  test<int32_t>(INT32_MAX, std::to_string(INT32_MAX));
   
  test<int64_t>(INT64_MIN, std::to_string(INT64_MIN)); 
  test<int64_t>(INT64_MAX, std::to_string(INT64_MAX)); 

  test<uint8_t>(UINT8_MAX, std::to_string(UINT8_MAX)); 
  test<uint16_t>(UINT16_MAX, std::to_string(UINT16_MAX)); 
  test<uint32_t>(UINT32_MAX, std::to_string(UINT32_MAX)); 
  test<uint64_t>(UINT64_MAX, std::to_string(UINT64_MAX)); 
  
  test<std::size_t>(SIZE_MAX, std::to_string(SIZE_MAX));
}